

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O3

int __thiscall LogOutput::remove(LogOutput *this,char *__filename)

{
  int iVar1;
  __shared_ptr<LogOutput,(__gnu_cxx::_Lock_policy)2> a_Stack_18 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_10;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&sOutputsMutex);
  if (iVar1 == 0) {
    std::__shared_ptr<LogOutput,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<LogOutput,void>
              (a_Stack_18,
               (__weak_ptr<LogOutput,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<LogOutput>);
    Set<std::shared_ptr<LogOutput>_>::remove(&sOutputs,(char *)a_Stack_18);
    if (local_10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_10);
    }
    iVar1 = pthread_mutex_unlock((pthread_mutex_t *)&sOutputsMutex);
    return iVar1;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void LogOutput::remove()
{
    std::lock_guard<std::mutex> lock(sOutputsMutex);
    sOutputs.remove(shared_from_this());
}